

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O0

Aig_Man_t * Fra_LcrCreatePart(Fra_Lcr_t *p,Vec_Int_t *vPart)

{
  Aig_Man_t *pAVar1;
  Fra_Cla_t *pCla;
  int iVar2;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int local_38;
  int i;
  int Out;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Int_t *vPart_local;
  Fra_Lcr_t *p_local;
  
  p_00 = Aig_ManStartFrom(p->pAig);
  Aig_ManIncrementTravId(p->pAig);
  pAVar1 = p->pAig;
  pAVar3 = Aig_ManConst1(p->pAig);
  Aig_ObjSetTravIdCurrent(pAVar1,pAVar3);
  pAVar3 = Aig_ManConst1(p_00);
  pAVar4 = Aig_ManConst1(p->pAig);
  (pAVar4->field_5).pData = pAVar3;
  for (local_38 = 0; iVar2 = Vec_IntSize(vPart), local_38 < iVar2; local_38 = local_38 + 1) {
    iVar2 = Vec_IntEntry(vPart,local_38);
    pAVar3 = Aig_ManCo(p->pAig,iVar2);
    if ((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) == 0) {
      _i = Aig_ManConst1(p_00);
    }
    else {
      pCla = p->pCla;
      pAVar1 = p->pAig;
      pAVar4 = Aig_ObjFanin0(pAVar3);
      pAVar4 = Fra_LcrCreatePart_rec(pCla,p_00,pAVar1,pAVar4);
      iVar2 = Aig_ObjFaninC0(pAVar3);
      _i = Aig_NotCond(pAVar4,iVar2);
    }
    Aig_ObjCreateCo(p_00,_i);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Fra_LcrCreatePart( Fra_Lcr_t * p, Vec_Int_t * vPart )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int Out, i;
    // create new AIG for this partition
    pNew = Aig_ManStartFrom( p->pAig );
    Aig_ManIncrementTravId( p->pAig );
    Aig_ObjSetTravIdCurrent( p->pAig, Aig_ManConst1(p->pAig) );
    Aig_ManConst1(p->pAig)->pData = Aig_ManConst1(pNew);
    Vec_IntForEachEntry( vPart, Out, i )
    {
        pObj = Aig_ManCo( p->pAig, Out );
        if ( pObj->fMarkA )
        {
            pObjNew = Fra_LcrCreatePart_rec( p->pCla, pNew, p->pAig, Aig_ObjFanin0(pObj) );
            pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
        }
        else
            pObjNew = Aig_ManConst1( pNew );
        Aig_ObjCreateCo( pNew, pObjNew ); 
    }
    return pNew;
}